

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O0

int count_rows_db(feed_db_t *db,char *table_name)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char *pcVar3;
  char *query_buf;
  sqlite3_stmt *psStack_30;
  int query_buf_len;
  sqlite3_stmt *stmt;
  char *pcStack_20;
  int count;
  char *table_name_local;
  feed_db_t *db_local;
  
  stmt._4_4_ = -1;
  pcStack_20 = table_name;
  table_name_local = (char *)db;
  sVar2 = strlen(table_name);
  iVar1 = (int)sVar2 + 0x19;
  __s = (char *)malloc((long)iVar1);
  if (__s == (char *)0x0) {
    db_local._4_4_ = -1;
  }
  else {
    snprintf(__s,(long)iVar1,"SELECT count(*) FROM `%s`;",pcStack_20);
    sqlite3_prepare_v2(*(sqlite3 **)(table_name_local + 8),__s,-1,&stack0xffffffffffffffd0,
                       (char **)0x0);
    iVar1 = sqlite3_step(psStack_30);
    *(int *)(table_name_local + 0x18) = iVar1;
    if (*(int *)(table_name_local + 0x18) == 100) {
      stmt._4_4_ = sqlite3_column_int(psStack_30,0);
    }
    else {
      pcVar3 = sqlite3_errmsg(*(sqlite3 **)(table_name_local + 8));
      pcVar3 = strdup(pcVar3);
      *(char **)(table_name_local + 0x10) = pcVar3;
    }
    sqlite3_finalize(psStack_30);
    free(__s);
    db_local._4_4_ = stmt._4_4_;
  }
  return db_local._4_4_;
}

Assistant:

int count_rows_db(feed_db_t *db, const char *table_name) {
    int count = -1;
    sqlite3_stmt *stmt;

    int query_buf_len = 25 + strlen(table_name);
    char *query_buf = malloc(sizeof(char) * query_buf_len);
    if (query_buf == NULL) {
        return -1;
    }

    snprintf(query_buf, query_buf_len, "SELECT count(*) FROM `%s`;", table_name);

    sqlite3_prepare_v2(db->conn, query_buf, -1, &stmt, NULL);
    db->rc = sqlite3_step(stmt);

    if (db->rc == SQLITE_ROW) {
        count = sqlite3_column_int(stmt, 0);
    } else {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
    }

    sqlite3_finalize(stmt);
    free(query_buf);
    return count;
}